

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cSparseTextureTests.cpp
# Opt level: O3

bool __thiscall
gl4cts::SparseTextureCommitmentTestCase::verifyInvalidValueErrors
          (SparseTextureCommitmentTestCase *this,Functions *gl,GLint target,GLint format,
          GLuint *texture)

{
  stringstream *log;
  bool bVar1;
  bool bVar2;
  GLenum GVar3;
  
  log = &this->mLog;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&this->field_0x88,"Verify INVALID_VALUE Errors - ",0x1e);
  (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[8])
            (this,gl,(ulong)(uint)target,(ulong)(uint)format,texture,1);
  bVar2 = false;
  (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[5])
            (this,gl,(ulong)(uint)target,(ulong)(uint)format,texture,0,1,0,0,
             (ulong)(uint)(this->mState).pageSizeX,(ulong)(uint)(this->mState).pageSizeY,
             (ulong)(uint)(this->mState).pageSizeZ,1);
  GVar3 = (*gl->getError)();
  bVar1 = SparseTextureUtils::verifyError
                    (log,"texPageCommitment [commitment offsetX not multiple of page size X]",GVar3,
                     0x501);
  if (bVar1) {
    bVar2 = false;
    (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[5])
              (this,gl,(ulong)(uint)target,(ulong)(uint)format,texture,0,0,1,0,
               (ulong)(uint)(this->mState).pageSizeX,(ulong)(uint)(this->mState).pageSizeY,
               (ulong)(uint)(this->mState).pageSizeZ,1);
    GVar3 = (*gl->getError)();
    bVar1 = SparseTextureUtils::verifyError
                      (log,"texPageCommitment [commitment offsetY not multiple of page size Y]",
                       GVar3,0x501);
    if ((bVar1) && (((target == 0x806f || (target == 0x9009)) || (bVar2 = true, target == 0x8c1a))))
    {
      (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[5])
                (this,gl,(ulong)(uint)target,(ulong)(uint)format,texture,0,0,0,
                 (ulong)(uint)(this->mState).minDepth,(ulong)(uint)(this->mState).pageSizeX,
                 (ulong)(uint)(this->mState).pageSizeY,(ulong)(uint)(this->mState).pageSizeZ,1);
      GVar3 = (*gl->getError)();
      bVar2 = SparseTextureUtils::verifyError
                        (log,"texPageCommitment [commitment offsetZ not multiple of page size Z]",
                         GVar3,0x501);
    }
  }
  (*gl->deleteTextures)(1,texture);
  GVar3 = (*gl->getError)();
  glu::checkError(GVar3,"GenTextures",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTextureTests.cpp"
                  ,0xd4);
  return bVar2;
}

Assistant:

bool SparseTextureCommitmentTestCase::verifyInvalidValueErrors(const Functions& gl, GLint target, GLint format,
															   GLuint& texture)
{
	mLog << "Verify INVALID_VALUE Errors - ";

	bool result = true;

	sparseAllocateTexture(gl, target, format, texture, 1);

	// Case 1 - commitment offset not multiple of page size in corresponding dimension
	texPageCommitment(gl, target, format, texture, 0, 1, 0, 0, mState.pageSizeX, mState.pageSizeY, mState.pageSizeZ,
					  GL_TRUE);
	result = SparseTextureUtils::verifyError(mLog, "texPageCommitment [commitment offsetX not multiple of page size X]",
											 gl.getError(), GL_INVALID_VALUE);
	if (!result)
		goto verifing_invalid_value_end;

	texPageCommitment(gl, target, format, texture, 0, 0, 1, 0, mState.pageSizeX, mState.pageSizeY, mState.pageSizeZ,
					  GL_TRUE);
	result = SparseTextureUtils::verifyError(mLog, "texPageCommitment [commitment offsetY not multiple of page size Y]",
											 gl.getError(), GL_INVALID_VALUE);
	if (!result)
		goto verifing_invalid_value_end;

	if (target == GL_TEXTURE_3D || target == GL_TEXTURE_2D_ARRAY || target == GL_TEXTURE_CUBE_MAP_ARRAY)
	{
		texPageCommitment(gl, target, format, texture, 0, 0, 0, mState.minDepth, mState.pageSizeX, mState.pageSizeY,
						  mState.pageSizeZ, GL_TRUE);
		result =
			SparseTextureUtils::verifyError(mLog, "texPageCommitment [commitment offsetZ not multiple of page size Z]",
											gl.getError(), GL_INVALID_VALUE);
		if (!result)
			goto verifing_invalid_value_end;
	}

verifing_invalid_value_end:

	Texture::Delete(gl, texture);

	return result;
}